

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MS3DImporter::ReadComments<Assimp::MS3DImporter::TempGroup>
          (MS3DImporter *this,StreamReaderLE *stream,
          vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          *outp)

{
  int8_t *piVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  Logger *this_00;
  DeadlyImportError *this_01;
  uint uVar6;
  bool bVar7;
  allocator local_51;
  string local_50;
  
  uVar2 = StreamReader<false,_false>::Get<unsigned_short>(stream);
  uVar6 = (uint)uVar2;
  do {
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar7) {
      return;
    }
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(stream);
    uVar4 = StreamReader<false,_false>::Get<unsigned_int>(stream);
    lVar5 = (long)(outp->
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(outp->
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)uVar3 < (ulong)(lVar5 / 0x68)) {
      piVar1 = stream->current;
      if ((uint)(*(int *)&stream->end - (int)piVar1) < uVar4) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10,piVar1,lVar5 % 0x68);
        std::__cxx11::string::string
                  ((string *)&local_50,"MS3D: Failure reading comment, length field is out of range"
                   ,&local_51);
        DeadlyImportError::DeadlyImportError(this_01,&local_50);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,piVar1,piVar1 + uVar4);
      std::__cxx11::string::operator=
                ((string *)
                 &(outp->
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar3].comment,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,"MS3D: Invalid index in comment section");
    }
    StreamReader<false,_false>::IncPtr(stream,(ulong)uVar4);
  } while( true );
}

Assistant:

void MS3DImporter :: ReadComments(StreamReaderLE& stream, std::vector<T>& outp)
{
    uint16_t cnt;
    stream >> cnt;

    for(unsigned int i = 0; i < cnt; ++i) {
        uint32_t index, clength;
        stream >> index >> clength;

        if(index >= outp.size()) {
            ASSIMP_LOG_WARN("MS3D: Invalid index in comment section");
        }
        else if (clength > stream.GetRemainingSize()) {
            throw DeadlyImportError("MS3D: Failure reading comment, length field is out of range");
        }
        else {
            outp[index].comment = std::string(reinterpret_cast<char*>(stream.GetPtr()),clength);
        }
        stream.IncPtr(clength);
    }
}